

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

char * __thiscall QGenericItemModel::index(QGenericItemModel *this,char *__s,int __c)

{
  undefined4 in_ECX;
  long in_FS_OFFSET;
  ConstOp unaff_retaddr;
  QGenericItemModelImplBase *in_stack_00000008;
  int *args;
  
  args = *(int **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84f660);
  QGenericItemModelImplBase::callConst<QModelIndex,int,int,QModelIndex>
            (in_stack_00000008,unaff_retaddr,args,(int *)CONCAT44(__c,in_ECX),(QModelIndex *)__s);
  if (*(int **)(in_FS_OFFSET + 0x28) == args) {
    return (char *)this;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::index(int row, int column, const QModelIndex &parent) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Index, row, column, parent);
}